

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool __thiscall testing::internal::String::EndsWithCaseInsensitive(String *this,char *suffix)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  bool local_39;
  size_t suffix_len;
  size_t this_len;
  char *suffix_local;
  String *this_local;
  
  if ((suffix != (char *)0x0) && (bVar1 = CStringEquals(suffix,""), !bVar1)) {
    pcVar2 = c_str(this);
    if (pcVar2 == (char *)0x0) {
      return false;
    }
    pcVar2 = c_str(this);
    sVar3 = strlen(pcVar2);
    sVar4 = strlen(suffix);
    local_39 = false;
    if (sVar4 <= sVar3) {
      pcVar2 = c_str(this);
      local_39 = CaseInsensitiveCStringEquals(pcVar2 + (sVar3 - sVar4),suffix);
    }
    return local_39;
  }
  return true;
}

Assistant:

bool String::EndsWithCaseInsensitive(const char* suffix) const {
  if (suffix == NULL || CStringEquals(suffix, "")) return true;

  if (c_str() == NULL) return false;

  const size_t this_len = strlen(c_str());
  const size_t suffix_len = strlen(suffix);
  return (this_len >= suffix_len) &&
         CaseInsensitiveCStringEquals(c_str() + this_len - suffix_len, suffix);
}